

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int alloc_vprintf2(char **buf,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  int local_44;
  size_t sStack_40;
  int len;
  size_t size;
  va_list ap_copy;
  __va_list_tag *ap_local;
  char *fmt_local;
  char **buf_local;
  
  sStack_40 = 0x800;
  local_44 = -1;
  *buf = (char *)0x0;
  ap_copy[0].reg_save_area = ap;
  while( true ) {
    if (-1 < local_44) {
      return local_44;
    }
    if (*buf != (char *)0x0) {
      mg_free(*buf);
    }
    sStack_40 = sStack_40 * 4;
    pcVar1 = (char *)mg_malloc(sStack_40);
    *buf = pcVar1;
    if (*buf == (char *)0x0) break;
    ap_copy[0].overflow_arg_area = *(void **)((long)ap_copy[0].reg_save_area + 0x10);
    size = *ap_copy[0].reg_save_area;
    ap_copy[0]._0_8_ = *(undefined8 *)((long)ap_copy[0].reg_save_area + 8);
    local_44 = vsnprintf(*buf,sStack_40 - 1,fmt,&size);
    (*buf)[sStack_40 - 1] = '\0';
  }
  return local_44;
}

Assistant:

static int
alloc_vprintf2(char **buf, const char *fmt, va_list ap)
{
	va_list ap_copy;
	size_t size = MG_BUF_LEN / 4;
	int len = -1;

	*buf = NULL;
	while (len < 0) {
		if (*buf) {
			mg_free(*buf);
		}

		size *= 4;
		*buf = (char *)mg_malloc(size);
		if (!*buf) {
			break;
		}

		va_copy(ap_copy, ap);
		len = vsnprintf_impl(*buf, size - 1, fmt, ap_copy);
		va_end(ap_copy);
		(*buf)[size - 1] = 0;
	}

	return len;
}